

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcp_echo_server.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *str;
  InetAddress udpLisetenAddr;
  LogLevel LVar1;
  sz_pid_t sVar2;
  uint uVar3;
  LogStream *pLVar4;
  self *psVar5;
  SourceFile file;
  int local_29b8;
  undefined1 local_2980 [8];
  EchoServer server;
  string local_27d8 [32];
  undefined8 uStack_27b8;
  undefined4 uStack_27b0;
  uint32_t local_27ac;
  undefined4 uStack_27a8;
  undefined8 uStack_27a4;
  undefined1 local_2798 [8];
  KcpTcpEventLoop loop;
  undefined1 local_1058 [4];
  int i;
  vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> udpListenAddr;
  undefined1 auStack_1038 [8];
  InetAddress tcpListenAddr;
  int kcpMode;
  int mode;
  uint16_t sSvrPort;
  char *szSvrip;
  undefined1 local_ff8 [12];
  Logger local_fe8;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  sznet::sztool_memcheck();
  signal(2,StopSignal);
  signal(0xf,StopSignal);
  LVar1 = sznet::Logger::logLevel();
  if ((int)LVar1 < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_ff8,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/kcp_echo/kcp_echo_server.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff8._0_8_;
    file.m_size = local_ff8._8_4_;
    sznet::Logger::Logger(&local_fe8,file,0x7f);
    pLVar4 = sznet::Logger::stream(&local_fe8);
    psVar5 = sznet::LogStream::operator<<(pLVar4,"pid = ");
    sVar2 = sznet::sz_getpid();
    pLVar4 = sznet::LogStream::operator<<(psVar5,sVar2);
    psVar5 = sznet::LogStream::operator<<(pLVar4,", tid = ");
    sVar2 = sznet::CurrentThread::tid();
    sznet::LogStream::operator<<(psVar5,sVar2);
    sznet::Logger::~Logger(&local_fe8);
  }
  if ((int)argv_local < 6) {
    printf("Usage: %s ip port thread_num mode(1-echo, others-RTT) kcp_mode(1-normal, others-quick)\n"
           ,*local_18);
    argv_local._4_4_ = 0;
  }
  else {
    str = local_18[1];
    uVar3 = atoi(local_18[2]);
    local_29b8 = atoi(local_18[3]);
    if (local_29b8 == 0) {
      local_29b8 = 2;
    }
    numThreads = local_29b8;
    tcpListenAddr.field_0.m_addr6.sin6_scope_id = atoi(local_18[4]);
    tcpListenAddr.field_0._20_4_ = atoi(local_18[5]);
    sznet::StringArg::StringArg
              ((StringArg *)
               &udpListenAddr.
                super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,str);
    sznet::net::InetAddress::InetAddress
              ((InetAddress *)auStack_1038,
               (StringArg)
               udpListenAddr.
               super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(uint16_t)uVar3,false);
    std::vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>::vector
              ((vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *)
               local_1058);
    for (loop._5940_4_ = 1; (int)loop._5940_4_ <= numThreads; loop._5940_4_ = loop._5940_4_ + 1) {
      loop.m_kcpMode = (uVar3 & 0xffff) + loop._5940_4_;
      std::vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>::
      emplace_back<int>((vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *
                        )local_1058,&loop.m_kcpMode);
    }
    uStack_27a8 = tcpListenAddr.field_0._8_4_;
    uStack_27a4 = tcpListenAddr.field_0._12_8_;
    uStack_27b8 = auStack_1038;
    uStack_27b0 = tcpListenAddr.field_0._0_4_;
    local_27ac = tcpListenAddr.field_0.m_addr6.sin6_flowinfo;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_27d8,"base",(allocator *)((long)&server.m_kcpMode + 3));
    udpLisetenAddr.field_0._8_4_ = uStack_27b0;
    udpLisetenAddr.field_0._0_8_ = uStack_27b8;
    udpLisetenAddr.field_0._12_4_ = local_27ac;
    udpLisetenAddr.field_0._16_4_ = uStack_27a8;
    udpLisetenAddr.field_0._20_8_ = uStack_27a4;
    sznet::net::KcpTcpEventLoop::KcpTcpEventLoop
              ((KcpTcpEventLoop *)local_2798,udpLisetenAddr,(string *)local_27d8,0,1);
    std::__cxx11::string::~string(local_27d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&server.m_kcpMode + 3));
    g_pMainLoopsRun = (EventLoop *)local_2798;
    EchoServer::EchoServer
              ((EchoServer *)local_2980,(KcpTcpEventLoop *)g_pMainLoopsRun,
               (vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *)
               local_1058,(InetAddress *)auStack_1038,tcpListenAddr.field_0.m_addr6.sin6_scope_id,
               tcpListenAddr.field_0._20_4_);
    EchoServer::start((EchoServer *)local_2980);
    sznet::net::EventLoop::loop((EventLoop *)local_2798);
    argv_local._4_4_ = 0;
    EchoServer::~EchoServer((EchoServer *)local_2980);
    sznet::net::KcpTcpEventLoop::~KcpTcpEventLoop((KcpTcpEventLoop *)local_2798);
    std::vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>::~vector
              ((vector<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_> *)
               local_1058);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    sznet::sztool_memcheck();
#ifdef _WIN32
    static int block = 0;
    if (block)
    {
        _CrtSetBreakAlloc(block);
    }
#endif

    signal(SIGINT, StopSignal);
    signal(SIGTERM, StopSignal);

    LOG_INFO << "pid = " << sz_getpid() << ", tid = " << CurrentThread::tid();
    if (argc <= 5)
    {
        printf("Usage: %s ip port thread_num mode(1-echo, others-RTT) kcp_mode(1-normal, others-quick)\n", argv[0]);
        return 0;
    }

    char* szSvrip = argv[1];
    uint16_t sSvrPort = static_cast<uint16_t>(atoi(argv[2]));
    numThreads = atoi(argv[3]);
    numThreads = (numThreads == 0 ? 2 : numThreads);
    int mode = atoi(argv[4]);
    int kcpMode = atoi(argv[5]);
    
    InetAddress tcpListenAddr(szSvrip, sSvrPort);
    std::vector<InetAddress> udpListenAddr;
    for (int i = 1; i <= numThreads; ++i)
    {
        udpListenAddr.emplace_back(sSvrPort + i);
    }

    KcpTcpEventLoop loop(tcpListenAddr, "base", 0);
    g_pMainLoopsRun = &loop;
    EchoServer server(&loop, udpListenAddr, tcpListenAddr, mode, kcpMode);

    server.start();

    loop.loop();

    return 0;
}